

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong local_1208;
  size_t local_11d8;
  ulong local_11d0 [564];
  
  puVar22 = local_11d0;
  local_11d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar47._4_4_ = fVar1;
  auVar47._0_4_ = fVar1;
  auVar47._8_4_ = fVar1;
  auVar47._12_4_ = fVar1;
  auVar47._16_4_ = fVar1;
  auVar47._20_4_ = fVar1;
  auVar47._24_4_ = fVar1;
  auVar47._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar48._4_4_ = fVar2;
  auVar48._0_4_ = fVar2;
  auVar48._8_4_ = fVar2;
  auVar48._12_4_ = fVar2;
  auVar48._16_4_ = fVar2;
  auVar48._20_4_ = fVar2;
  auVar48._24_4_ = fVar2;
  auVar48._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar49._4_4_ = fVar3;
  auVar49._0_4_ = fVar3;
  auVar49._8_4_ = fVar3;
  auVar49._12_4_ = fVar3;
  auVar49._16_4_ = fVar3;
  auVar49._20_4_ = fVar3;
  auVar49._24_4_ = fVar3;
  auVar49._28_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar50._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar50._8_4_ = -fVar1;
  auVar50._12_4_ = -fVar1;
  auVar50._16_4_ = -fVar1;
  auVar50._20_4_ = -fVar1;
  auVar50._24_4_ = -fVar1;
  auVar50._28_4_ = -fVar1;
  auVar51._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar51._8_4_ = -fVar2;
  auVar51._12_4_ = -fVar2;
  auVar51._16_4_ = -fVar2;
  auVar51._20_4_ = -fVar2;
  auVar51._24_4_ = -fVar2;
  auVar51._28_4_ = -fVar2;
  auVar52._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar52._8_4_ = -fVar3;
  auVar52._12_4_ = -fVar3;
  auVar52._16_4_ = -fVar3;
  auVar52._20_4_ = -fVar3;
  auVar52._24_4_ = -fVar3;
  auVar52._28_4_ = -fVar3;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar53._4_4_ = iVar4;
  auVar53._0_4_ = iVar4;
  auVar53._8_4_ = iVar4;
  auVar53._12_4_ = iVar4;
  auVar53._16_4_ = iVar4;
  auVar53._20_4_ = iVar4;
  auVar53._24_4_ = iVar4;
  auVar53._28_4_ = iVar4;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar54._4_4_ = iVar4;
  auVar54._0_4_ = iVar4;
  auVar54._8_4_ = iVar4;
  auVar54._12_4_ = iVar4;
  auVar54._16_4_ = iVar4;
  auVar54._20_4_ = iVar4;
  auVar54._24_4_ = iVar4;
  auVar54._28_4_ = iVar4;
  bVar27 = true;
  do {
    uVar24 = puVar22[-1];
    puVar22 = puVar22 + -1;
    while ((uVar24 & 8) == 0) {
      auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar20),auVar50,auVar47);
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar21),auVar51,auVar48);
      auVar8 = vpmaxsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar55));
      auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar23),auVar52,auVar49);
      auVar9 = vpmaxsd_avx2(ZEXT1632(auVar30),auVar53);
      auVar8 = vpmaxsd_avx2(auVar8,auVar9);
      auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar20 ^ 0x20)),auVar50,
                                auVar47);
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar21 ^ 0x20)),auVar51,
                                auVar48);
      auVar9 = vpminsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar55));
      auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar23 ^ 0x20)),auVar52,
                                auVar49);
      auVar10 = vpminsd_avx2(ZEXT1632(auVar30),auVar54);
      auVar9 = vpminsd_avx2(auVar9,auVar10);
      uVar17 = vpcmpd_avx512vl(auVar8,auVar9,2);
      if ((char)uVar17 == '\0') goto LAB_00780aed;
      uVar25 = uVar24 & 0xfffffffffffffff0;
      lVar19 = 0;
      for (uVar24 = uVar17; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar24 = *(ulong *)(uVar25 + lVar19 * 8);
      uVar16 = (uint)uVar17 - 1 & (uint)uVar17;
      uVar17 = (ulong)uVar16;
      if (uVar16 != 0) {
        *puVar22 = uVar24;
        lVar19 = 0;
        for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          lVar19 = lVar19 + 1;
        }
        uVar16 = uVar16 - 1 & uVar16;
        uVar17 = (ulong)uVar16;
        bVar26 = uVar16 == 0;
        while( true ) {
          puVar22 = puVar22 + 1;
          uVar24 = *(ulong *)(uVar25 + lVar19 * 8);
          if (bVar26) break;
          *puVar22 = uVar24;
          lVar19 = 0;
          for (uVar24 = uVar17; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
            lVar19 = lVar19 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          bVar26 = uVar17 == 0;
        }
      }
    }
    uVar17 = (ulong)((uint)uVar24 & 0xf);
    if (uVar17 != 8) {
      uVar5 = *(undefined4 *)(ray + k * 4);
      auVar55._4_4_ = uVar5;
      auVar55._0_4_ = uVar5;
      auVar55._8_4_ = uVar5;
      auVar55._12_4_ = uVar5;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar56._4_4_ = uVar5;
      auVar56._0_4_ = uVar5;
      auVar56._8_4_ = uVar5;
      auVar56._12_4_ = uVar5;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar57._4_4_ = uVar5;
      auVar57._0_4_ = uVar5;
      auVar57._8_4_ = uVar5;
      auVar57._12_4_ = uVar5;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar58._4_4_ = uVar5;
      auVar58._0_4_ = uVar5;
      auVar58._8_4_ = uVar5;
      auVar58._12_4_ = uVar5;
      uVar24 = uVar24 & 0xfffffffffffffff0;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar59._4_4_ = uVar5;
      auVar59._0_4_ = uVar5;
      auVar59._8_4_ = uVar5;
      auVar59._12_4_ = uVar5;
      auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      lVar19 = 0;
      do {
        lVar18 = lVar19 * 0xb0;
        auVar44 = *(undefined1 (*) [16])(uVar24 + 0x80 + lVar18);
        auVar46 = *(undefined1 (*) [16])(uVar24 + 0x40 + lVar18);
        auVar45 = *(undefined1 (*) [16])(uVar24 + 0x70 + lVar18);
        auVar6 = *(undefined1 (*) [16])(uVar24 + 0x50 + lVar18);
        auVar31 = vmulps_avx512vl(auVar46,auVar44);
        auVar32 = vfmsub231ps_avx512vl(auVar31,auVar45,auVar6);
        auVar31 = *(undefined1 (*) [16])(uVar24 + 0x60 + lVar18);
        auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + lVar18),auVar55);
        auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x10 + lVar18),auVar56);
        auVar7 = *(undefined1 (*) [16])(uVar24 + 0x30 + lVar18);
        auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + lVar18),auVar57);
        auVar36 = vmulps_avx512vl(auVar6,auVar31);
        auVar37 = vfmsub231ps_avx512vl(auVar36,auVar44,auVar7);
        auVar36 = vmulps_avx512vl(auVar7,auVar45);
        auVar38 = vfmsub231ps_avx512vl(auVar36,auVar31,auVar46);
        auVar36 = vmulps_avx512vl(auVar59,auVar35);
        auVar39 = vfmsub231ps_avx512vl(auVar36,auVar34,auVar30);
        auVar36 = vmulps_avx512vl(auVar30,auVar33);
        auVar40 = vfmsub231ps_avx512vl(auVar36,auVar35,auVar58);
        auVar36 = vmulps_avx512vl(auVar58,auVar34);
        auVar41 = vfmsub231ps_avx512vl(auVar36,auVar33,auVar59);
        auVar36 = vmulps_avx512vl(auVar38,auVar30);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar37,auVar59);
        auVar42 = vfmadd231ps_avx512vl(auVar36,auVar32,auVar58);
        auVar36._8_4_ = 0x7fffffff;
        auVar36._0_8_ = 0x7fffffff7fffffff;
        auVar36._12_4_ = 0x7fffffff;
        auVar36 = vandps_avx512vl(auVar42,auVar36);
        auVar43._8_4_ = 0x80000000;
        auVar43._0_8_ = 0x8000000080000000;
        auVar43._12_4_ = 0x80000000;
        auVar43 = vandps_avx512vl(auVar42,auVar43);
        auVar44 = vmulps_avx512vl(auVar44,auVar41);
        auVar44 = vfmadd231ps_avx512vl(auVar44,auVar40,auVar45);
        auVar44 = vfmadd231ps_avx512vl(auVar44,auVar39,auVar31);
        auVar44 = vxorps_avx512vl(auVar43,auVar44);
        auVar45 = vmulps_avx512vl(auVar6,auVar41);
        auVar46 = vfmadd231ps_avx512vl(auVar45,auVar46,auVar40);
        auVar46 = vfmadd231ps_avx512vl(auVar46,auVar7,auVar39);
        auVar46 = vxorps_avx512vl(auVar43,auVar46);
        auVar45 = ZEXT816(0) << 0x20;
        uVar11 = vcmpps_avx512vl(auVar44,auVar45,5);
        uVar12 = vcmpps_avx512vl(auVar46,auVar45,5);
        uVar13 = vcmpps_avx512vl(auVar42,auVar45,4);
        auVar44 = vaddps_avx512vl(auVar44,auVar46);
        uVar14 = vcmpps_avx512vl(auVar44,auVar36,2);
        bVar28 = (byte)uVar11 & (byte)uVar12 & (byte)uVar13 & (byte)uVar14;
        if (bVar28 != 0) {
          auVar44 = vmulps_avx512vl(auVar38,auVar35);
          auVar44 = vfmadd213ps_avx512vl(auVar34,auVar37,auVar44);
          auVar46 = vfmadd213ps_avx512vl(auVar33,auVar32,auVar44);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar44._4_4_ = uVar5;
          auVar44._0_4_ = uVar5;
          auVar44._8_4_ = uVar5;
          auVar44._12_4_ = uVar5;
          auVar44 = vmulps_avx512vl(auVar36,auVar44);
          auVar45 = vxorps_avx512vl(auVar43,auVar46);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar46._4_4_ = uVar5;
          auVar46._0_4_ = uVar5;
          auVar46._8_4_ = uVar5;
          auVar46._12_4_ = uVar5;
          auVar46 = vmulps_avx512vl(auVar36,auVar46);
          uVar11 = vcmpps_avx512vl(auVar45,auVar46,2);
          uVar12 = vcmpps_avx512vl(auVar44,auVar45,1);
          bVar29 = (byte)uVar11 & (byte)uVar12;
          if ((bVar29 & bVar28) != 0) {
            local_1208 = (ulong)(bVar29 & bVar28);
            do {
              uVar25 = 0;
              for (uVar15 = local_1208; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000
                  ) {
                uVar25 = uVar25 + 1;
              }
              if ((((context->scene->geometries).items
                    [*(uint *)(lVar18 + uVar24 + 0x90 + uVar25 * 4)].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x90)) != 0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar27;
              }
              local_1208 = local_1208 ^ 1L << (uVar25 & 0x3f);
            } while (local_1208 != 0);
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != uVar17 - 8);
    }
LAB_00780aed:
    bVar27 = puVar22 != &local_11d8;
    if (!bVar27) {
      return bVar27;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }